

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# btDantzigLCP.cpp
# Opt level: O0

void btLDLTAddTL(btScalar *L,btScalar *d,btScalar *a,int n,int nskip,
                btAlignedObjectArray<float> *scratch)

{
  float *pfVar1;
  float *pfVar2;
  float *pfVar3;
  int in_ECX;
  float *in_RDX;
  float *in_RSI;
  long in_RDI;
  int in_R8D;
  btAlignedObjectArray<float> *in_R9;
  float fVar4;
  float fVar5;
  float fVar6;
  float fVar7;
  float fVar8;
  float fVar9;
  float fVar10;
  btScalar Wp_1;
  btScalar ell_1;
  int p_1;
  btScalar *l;
  btScalar gamma2;
  btScalar gamma1_1;
  btScalar alphanew_1;
  btScalar dee_1;
  btScalar k2_1;
  btScalar k1_1;
  int j_1;
  btScalar *ll;
  btScalar ell;
  btScalar Wp;
  int p;
  btScalar *ll_1;
  btScalar k2;
  btScalar k1;
  btScalar gamma1;
  btScalar alphanew;
  btScalar dee;
  btScalar alpha2;
  btScalar alpha1;
  btScalar W21;
  btScalar W11;
  int j;
  btScalar *W2;
  btScalar *W1;
  int local_b4;
  float *in_stack_ffffffffffffff50;
  int in_stack_ffffffffffffff5c;
  undefined4 in_stack_ffffffffffffff60;
  undefined4 in_stack_ffffffffffffff64;
  int local_8c;
  long local_88;
  int local_74;
  float *local_70;
  float local_54;
  float local_50;
  int local_44;
  
  if (1 < in_ECX) {
    btAlignedObjectArray<float>::resize
              ((btAlignedObjectArray<float> *)
               CONCAT44(in_stack_ffffffffffffff64,in_stack_ffffffffffffff60),
               in_stack_ffffffffffffff5c,in_stack_ffffffffffffff50);
    pfVar1 = btAlignedObjectArray<float>::operator[](in_R9,0);
    pfVar2 = pfVar1 + in_R8D;
    *pfVar1 = 0.0;
    *pfVar2 = 0.0;
    for (local_44 = 1; local_44 < in_ECX; local_44 = local_44 + 1) {
      fVar4 = in_RDX[local_44];
      pfVar2[local_44] = fVar4 * 0.70710677;
      pfVar1[local_44] = fVar4 * 0.70710677;
    }
    fVar4 = (*in_RDX * 0.5 + 1.0) * 0.70710677;
    fVar5 = (*in_RDX * 0.5 + -1.0) * 0.70710677;
    local_50 = fVar4 * fVar4 * *in_RSI + 1.0;
    fVar6 = *in_RSI / local_50;
    fVar7 = fVar4 * fVar6;
    local_70 = (float *)(in_RDI + (long)in_R8D * 4);
    for (local_74 = 1; local_74 < in_ECX; local_74 = local_74 + 1) {
      fVar8 = pfVar1[local_74];
      fVar9 = *local_70;
      pfVar1[local_74] = -fVar4 * fVar9 + fVar8;
      pfVar2[local_74] = (-fVar5 * fVar7 + 1.0) * fVar8 + (fVar5 * fVar7 * fVar4 + -fVar5) * fVar9;
      local_70 = local_70 + in_R8D;
    }
    local_88 = in_RDI + (long)(in_R8D + 1) * 4;
    local_54 = -(fVar5 * fVar5) * fVar6 * 1.0 + 1.0;
    for (local_8c = 1; local_8c < in_ECX; local_8c = local_8c + 1) {
      fVar4 = pfVar1[local_8c];
      fVar5 = pfVar2[local_8c];
      fVar6 = fVar4 * fVar4 * in_RSI[local_8c] + local_50;
      fVar7 = in_RSI[local_8c] / fVar6;
      local_50 = local_50 * fVar7;
      fVar8 = -(fVar5 * fVar5) * local_50 + local_54;
      local_50 = local_50 / fVar8;
      in_RSI[local_8c] = local_54 * local_50;
      pfVar3 = (float *)(local_88 + (long)in_R8D * 4);
      local_b4 = local_8c;
      while (local_b4 = local_b4 + 1, local_b4 < in_ECX) {
        fVar9 = -fVar4 * *pfVar3 + pfVar1[local_b4];
        fVar10 = fVar4 * fVar7 * fVar9 + *pfVar3;
        pfVar1[local_b4] = fVar9;
        fVar9 = -fVar5 * fVar10 + pfVar2[local_b4];
        pfVar2[local_b4] = fVar9;
        *pfVar3 = -(fVar5 * local_50) * fVar9 + fVar10;
        pfVar3 = pfVar3 + in_R8D;
      }
      local_88 = local_88 + (long)(in_R8D + 1) * 4;
      local_54 = fVar8;
      local_50 = fVar6;
    }
  }
  return;
}

Assistant:

void btLDLTAddTL (btScalar *L, btScalar *d, const btScalar *a, int n, int nskip, btAlignedObjectArray<btScalar>& scratch)
{
  btAssert (L && d && a && n > 0 && nskip >= n);

  if (n < 2) return;
  scratch.resize(2*nskip);
  btScalar *W1 = &scratch[0];
  
  btScalar *W2 = W1 + nskip;

  W1[0] = btScalar(0.0);
  W2[0] = btScalar(0.0);
  for (int j=1; j<n; ++j) {
    W1[j] = W2[j] = (btScalar) (a[j] * SIMDSQRT12);
  }
  btScalar W11 = (btScalar) ((btScalar(0.5)*a[0]+1)*SIMDSQRT12);
  btScalar W21 = (btScalar) ((btScalar(0.5)*a[0]-1)*SIMDSQRT12);

  btScalar alpha1 = btScalar(1.0);
  btScalar alpha2 = btScalar(1.0);

  {
    btScalar dee = d[0];
    btScalar alphanew = alpha1 + (W11*W11)*dee;
    btAssert(alphanew != btScalar(0.0));
    dee /= alphanew;
    btScalar gamma1 = W11 * dee;
    dee *= alpha1;
    alpha1 = alphanew;
    alphanew = alpha2 - (W21*W21)*dee;
    dee /= alphanew;
    //btScalar gamma2 = W21 * dee;
    alpha2 = alphanew;
    btScalar k1 = btScalar(1.0) - W21*gamma1;
    btScalar k2 = W21*gamma1*W11 - W21;
    btScalar *ll = L + nskip;
    for (int p=1; p<n; ll+=nskip, ++p) {
      btScalar Wp = W1[p];
      btScalar ell = *ll;
      W1[p] =    Wp - W11*ell;
      W2[p] = k1*Wp +  k2*ell;
    }
  }

  btScalar *ll = L + (nskip + 1);
  for (int j=1; j<n; ll+=nskip+1, ++j) {
    btScalar k1 = W1[j];
    btScalar k2 = W2[j];

    btScalar dee = d[j];
    btScalar alphanew = alpha1 + (k1*k1)*dee;
    btAssert(alphanew != btScalar(0.0));
    dee /= alphanew;
    btScalar gamma1 = k1 * dee;
    dee *= alpha1;
    alpha1 = alphanew;
    alphanew = alpha2 - (k2*k2)*dee;
    dee /= alphanew;
    btScalar gamma2 = k2 * dee;
    dee *= alpha2;
    d[j] = dee;
    alpha2 = alphanew;

    btScalar *l = ll + nskip;
    for (int p=j+1; p<n; l+=nskip, ++p) {
      btScalar ell = *l;
      btScalar Wp = W1[p] - k1 * ell;
      ell += gamma1 * Wp;
      W1[p] = Wp;
      Wp = W2[p] - k2 * ell;
      ell -= gamma2 * Wp;
      W2[p] = Wp;
      *l = ell;
    }
  }
}